

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O1

void check_mpp_service_cap(RK_U32 *codec_type,RK_U32 *hw_ids,MppServiceCmdCap *cap)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  MppClientType type;
  long lVar6;
  ulong uVar7;
  RK_U32 val;
  RK_U32 hw_support;
  MppReqV1 mpp_req;
  MppClientType local_80;
  MppClientType local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  MppClientType *local_68;
  RK_U32 *local_58;
  MppServiceCmdCap *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  MppClientType *local_38;
  
  local_7c = VPU_CLIENT_VDPU1;
  mpp_env_get_u32("mpp_device_debug",&mpp_device_debug,0);
  *codec_type = 0;
  hw_ids[0] = 0;
  hw_ids[1] = 0;
  hw_ids[2] = 0;
  hw_ids[3] = 0;
  hw_ids[4] = 0;
  hw_ids[5] = 0;
  hw_ids[6] = 0;
  hw_ids[7] = 0;
  hw_ids[8] = 0;
  hw_ids[9] = 0;
  hw_ids[10] = 0;
  hw_ids[0xb] = 0;
  hw_ids[0xc] = 0;
  hw_ids[0xd] = 0;
  hw_ids[0xe] = 0;
  hw_ids[0xf] = 0;
  hw_ids[0x10] = 0;
  hw_ids[0x11] = 0;
  hw_ids[0x12] = 0;
  hw_ids[0x13] = 0;
  hw_ids[0x14] = 0;
  hw_ids[0x15] = 0;
  hw_ids[0x16] = 0;
  hw_ids[0x17] = 0;
  hw_ids[0x18] = 0;
  hw_ids[0x19] = 0;
  hw_ids[0x1a] = 0;
  hw_ids[0x1b] = 0;
  hw_ids[0x1c] = 0;
  hw_ids[0x1d] = 0;
  hw_ids[0x1e] = 0;
  hw_ids[0x1f] = 0;
  local_58 = hw_ids;
  pcVar4 = mpp_get_mpp_service_name();
  iVar2 = open64(pcVar4,0x80002);
  if (iVar2 < 0) {
    _mpp_log_l(2,"mpp_serivce","open mpp_service to check cmd capability failed\n",(char *)0x0);
    cap->support_cmd = 0;
    cap->query_cmd = 0;
    cap->init_cmd = 0;
    cap->send_cmd = 0;
    cap->poll_cmd = 0;
    cap->ctrl_cmd = 0;
    return;
  }
  local_78 = 0;
  uStack_70 = 0;
  local_68 = &local_7c;
  iVar3 = ioctl(iVar2,0x40047601);
  if (iVar3 == 0) {
    if (((byte)mpp_device_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_serivce","vcodec_support %08x\n","check_mpp_service_cap",(ulong)local_7c);
    }
    *codec_type = local_7c;
  }
  iVar3 = access("/proc/mpp_service/supports-cmd",0);
  local_50 = cap;
  if (iVar3 == 0) {
    cap->support_cmd = 1;
  }
  else {
    iVar3 = access("/proc/mpp_service/support_cmd",0);
    cap->support_cmd = (uint)(iVar3 == 0);
    if (iVar3 != 0) goto LAB_0012084c;
  }
  lVar6 = 0;
  do {
    uStack_40 = 0;
    local_80 = (&query_cfg[0].cmd_butt)[lVar6];
    local_48 = 2;
    local_38 = &local_80;
    iVar3 = ioctl(iVar2,0x40047601,&local_48);
    if (iVar3 == 0) {
      *(MppClientType *)((long)&local_50->query_cmd + lVar6) = local_80;
      if (((byte)mpp_device_debug & 2) != 0) {
        _mpp_log_l(4,"mpp_serivce","query %-11s support %04x\n","check_mpp_service_cap",
                   *(undefined8 *)((long)&query_cfg[0].name + lVar6 * 4));
      }
    }
    else {
      uVar1 = *(undefined8 *)((long)&query_cfg[0].name + lVar6 * 4);
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      _mpp_log_l(2,"mpp_serivce","query %-11s support error %s.\n","check_mpp_service_cap",uVar1,
                 pcVar4);
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
LAB_0012084c:
  close(iVar2);
  uVar7 = 0;
  do {
    type = (MppClientType)uVar7;
    if ((local_7c >> (type & (VPU_CLIENT_BUTT|VPU_CLIENT_VDPU2)) & 1) != 0) {
      local_80 = type;
      pcVar4 = mpp_get_mpp_service_name();
      iVar2 = open64(pcVar4,0x80002);
      if (iVar2 < 0) {
        _mpp_log_l(2,"mpp_serivce","open mpp_service to check cmd capability failed\n",(char *)0x0);
        return;
      }
      local_78 = 0x100;
      uStack_70 = 4;
      local_68 = &local_80;
      iVar3 = ioctl(iVar2,0x40047601,&local_78);
      if (iVar3 == 0) {
        local_78 = 1;
        uStack_70 = 4;
        local_68 = &local_80;
        iVar3 = ioctl(iVar2,0x40047601,&local_78);
        if (iVar3 == 0) {
          if (((byte)mpp_device_debug & 2) != 0) {
            pcVar4 = strof_client_type(type);
            _mpp_log_l(4,"mpp_serivce","client %-10s hw_id %08x\n","check_mpp_service_cap",pcVar4,
                       (ulong)local_80);
          }
          local_58[uVar7] = local_80;
        }
        else {
          pcVar4 = strof_client_type(type);
          _mpp_log_l(2,"mpp_serivce","check valid client %-10s for hw_id failed\n",(char *)0x0,
                     pcVar4);
        }
      }
      else {
        _mpp_log_l(2,"mpp_serivce","check valid client type %d failed\n",(char *)0x0,
                   uVar7 & 0xffffffff);
      }
      close(iVar2);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x20);
  return;
}

Assistant:

void check_mpp_service_cap(RK_U32 *codec_type, RK_U32 *hw_ids, MppServiceCmdCap *cap)
{
    MppReqV1 mpp_req;
    RK_S32 fd = -1;
    RK_S32 ret = 0;
    RK_U32 *cmd_butt = &cap->query_cmd;;
    RK_U32 hw_support = 0;
    RK_U32 val;
    RK_U32 i;

    /* for device check on startup */
    mpp_env_get_u32("mpp_device_debug", &mpp_device_debug, 0);

    *codec_type = 0;
    memset(hw_ids, 0, sizeof(RK_U32) * 32);

    /* check hw_support flag for valid client type */
    fd = open(mpp_get_mpp_service_name(), O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        mpp_err("open mpp_service to check cmd capability failed\n");
        memset(cap, 0, sizeof(*cap));
        return ;
    }
    ret = mpp_service_ioctl(fd, MPP_CMD_PROBE_HW_SUPPORT, 0, &hw_support);
    if (!ret) {
        mpp_dev_dbg_probe("vcodec_support %08x\n", hw_support);
        *codec_type = hw_support;
    }
    cap->support_cmd = !access("/proc/mpp_service/supports-cmd", F_OK) ||
                       !access("/proc/mpp_service/support_cmd", F_OK);
    if (cap->support_cmd) {
        for (i = 0; i < query_count; i++, cmd_butt++) {
            const MppServiceQueryCfg *cfg = &query_cfg[i];

            memset(&mpp_req, 0, sizeof(mpp_req));

            val = cfg->cmd_butt;
            mpp_req.cmd = MPP_CMD_QUERY_CMD_SUPPORT;
            mpp_req.data_ptr = REQ_DATA_PTR(&val);

            ret = (RK_S32)ioctl(fd, MPP_IOC_CFG_V1, &mpp_req);
            if (ret)
                mpp_err_f("query %-11s support error %s.\n", cfg->name, strerror(errno));
            else {
                *cmd_butt = val;
                mpp_dev_dbg_probe("query %-11s support %04x\n", cfg->name, val);
            }
        }
    }
    close(fd);

    /* check each valid client type for hw_id */
    /* kernel need to set client type then get hw_id */
    for (i = 0; i < 32; i++) {
        if (hw_support & (1 << i)) {
            val = i;

            fd = open(mpp_get_mpp_service_name(), O_RDWR | O_CLOEXEC);
            if (fd < 0) {
                mpp_err("open mpp_service to check cmd capability failed\n");
                break;
            }
            /* set client type first */
            ret = mpp_service_ioctl(fd, MPP_CMD_INIT_CLIENT_TYPE, sizeof(val), &val);
            if (ret) {
                mpp_err("check valid client type %d failed\n", i);
            } else {
                /* then get hw_id */
                ret = mpp_service_ioctl(fd, MPP_CMD_QUERY_HW_ID, sizeof(val), &val);
                if (!ret) {
                    mpp_dev_dbg_probe("client %-10s hw_id %08x\n",
                                      strof_client_type((MppClientType)i), val);
                    hw_ids[i] = val;
                } else
                    mpp_err("check valid client %-10s for hw_id failed\n",
                            strof_client_type((MppClientType)i));
            }
            close(fd);
        }
    }
}